

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O1

size_t __thiscall S2Polygon::SpaceUsed(S2Polygon *this)

{
  pointer puVar1;
  size_t sVar2;
  long lVar3;
  long lVar4;
  
  puVar1 = (this->loops_).
           super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((int)((ulong)((long)(this->loops_).
                          super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1) >> 3) < 1) {
    lVar3 = 0x80;
  }
  else {
    lVar3 = 0xd8;
    lVar4 = 0;
    do {
      sVar2 = S2Loop::SpaceUsed((S2Loop *)
                                puVar1[lVar4]._M_t.
                                super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t);
      lVar3 = lVar3 + sVar2;
      lVar4 = lVar4 + 1;
      puVar1 = (this->loops_).
               super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (lVar4 < (int)((ulong)((long)(this->loops_).
                                         super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1)
                          >> 3));
    lVar3 = lVar3 + -0x58;
  }
  sVar2 = MutableS2ShapeIndex::SpaceUsed(&this->index_);
  return sVar2 + lVar3;
}

Assistant:

size_t S2Polygon::SpaceUsed() const {
  size_t size = sizeof(*this);
  for (int i = 0; i < num_loops(); ++i) {
    size += loop(i)->SpaceUsed();
  }
  size += index_.SpaceUsed() - sizeof(index_);
  return size;
}